

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O0

void __thiscall unittest::UnitTest::TestGetValue(UnitTest *this)

{
  bool bVar1;
  mapped_type *sec_00;
  int local_264 [5];
  int c;
  int b;
  int a;
  mapped_type *local_228;
  mapped_type *sec;
  allocator<char> local_209;
  string local_208 [32];
  istringstream local_1e8 [8];
  istringstream ss;
  undefined1 local_68 [8];
  Ini<char> ini;
  UnitTest *this_local;
  
  ini.format.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  inipp::Ini<char>::Ini((Ini<char> *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_208,"[sec1]\na=2\nb=bla",&local_209);
  std::__cxx11::istringstream::istringstream(local_1e8,local_208,8);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  inipp::Ini<char>::parse
            ((Ini<char> *)local_68,(basic_istream<char,_std::char_traits<char>_> *)local_1e8);
  WriteMessage<char>((Ini<char> *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"sec1",(allocator<char> *)((long)&b + 3));
  sec_00 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                 *)local_68,(key_type *)&a);
  std::__cxx11::string::~string((string *)&a);
  std::allocator<char>::~allocator((allocator<char> *)((long)&b + 3));
  c = 4;
  local_264[4] = 7;
  local_264[3] = 10;
  local_228 = sec_00;
  bVar1 = inipp::get_value<char,int>(sec_00,"a",&c);
  Assert::IsTrue(bVar1);
  local_264[2] = 2;
  Assert::AreEqual<int>(&c,local_264 + 2);
  bVar1 = inipp::get_value<char,int>(local_228,"b",local_264 + 4);
  Assert::IsFalse(bVar1);
  local_264[1] = 7;
  Assert::AreEqual<int>(local_264 + 4,local_264 + 1);
  bVar1 = inipp::get_value<char,int>(local_228,"c",local_264 + 3);
  Assert::IsFalse(bVar1);
  local_264[0] = 10;
  Assert::AreEqual<int>(local_264 + 3,local_264);
  std::__cxx11::istringstream::~istringstream(local_1e8);
  inipp::Ini<char>::~Ini((Ini<char> *)local_68);
  return;
}

Assistant:

TEST_METHOD(TestGetValue)
		{
			Ini<char> ini;
			std::istringstream ss("[sec1]\na=2\nb=bla");
			ini.parse(ss);
			WriteMessage(ini);
			const auto & sec = ini.sections.at("sec1");
			int a = 4;
			int b = 7;
			int c = 10;
			Assert::IsTrue(get_value(sec, "a", a));
			Assert::AreEqual(a, 2);
			Assert::IsFalse(get_value(sec, "b", b));
			Assert::AreEqual(b, 7);
			Assert::IsFalse(get_value(sec, "c", c));
			Assert::AreEqual(c, 10);
		}